

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigSavePattern2(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  pVVar1 = p->vPiVars;
  iVar4 = pVVar1->nSize;
  if (0 < iVar4) {
    ppvVar2 = pVVar1->pArray;
    piVar3 = p->pSat->model;
    lVar5 = 0;
    do {
      if (piVar3[*(int *)((long)ppvVar2[lVar5] + 0x28)] == 1) {
        iVar4 = *ppvVar2[lVar5] + -1;
        p->pPatWords[iVar4 >> 5] = p->pPatWords[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
        iVar4 = pVVar1->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  return;
}

Assistant:

void Ivy_FraigSavePattern2( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
//    Ivy_ManForEachPi( p->pManFraig, pObj, i )
    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True )
        if ( p->pSat->model[Ivy_ObjSatNum(pObj)] == l_True )
//            Ivy_InfoSetBit( p->pPatWords, i );
            Ivy_InfoSetBit( p->pPatWords, pObj->Id - 1 );
}